

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

Matrix44 * jpgd::DCT_Upsample::operator+(Matrix44 *a,Matrix44 *b)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  Matrix44 *in_RDI;
  
  for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
    piVar1 = (int *)((long)a->v[0] + lVar10);
    iVar4 = piVar1[1];
    iVar5 = piVar1[2];
    iVar6 = piVar1[3];
    piVar2 = (int *)((long)b->v[0] + lVar10);
    iVar7 = piVar2[1];
    iVar8 = piVar2[2];
    iVar9 = piVar2[3];
    piVar3 = (int *)((long)in_RDI->v[0] + lVar10);
    *piVar3 = *piVar2 + *piVar1;
    piVar3[1] = iVar7 + iVar4;
    piVar3[2] = iVar8 + iVar5;
    piVar3[3] = iVar9 + iVar6;
  }
  return in_RDI;
}

Assistant:

inline Matrix44 operator + (const Matrix44& a, const Matrix44& b)
    {
      Matrix44 ret;
      for (int r = 0; r < NUM_ROWS; r++)
      {
        ret.at(r, 0) = a.at(r, 0) + b.at(r, 0);
        ret.at(r, 1) = a.at(r, 1) + b.at(r, 1);
        ret.at(r, 2) = a.at(r, 2) + b.at(r, 2);
        ret.at(r, 3) = a.at(r, 3) + b.at(r, 3);
      }
      return ret;
    }